

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_color nk_rgba_f(float r,float g,float b,float a)

{
  nk_color nVar1;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float a_local;
  float b_local;
  float g_local;
  float r_local;
  nk_color ret;
  
  local_20 = r;
  if (1.0 < r) {
    local_20 = 1.0;
  }
  if (local_20 <= 0.0) {
    local_28 = 0.0;
  }
  else {
    local_24 = r;
    if (1.0 < r) {
      local_24 = 1.0;
    }
    local_28 = local_24;
  }
  local_2c = g;
  if (1.0 < g) {
    local_2c = 1.0;
  }
  if (local_2c <= 0.0) {
    local_34 = 0.0;
  }
  else {
    local_30 = g;
    if (1.0 < g) {
      local_30 = 1.0;
    }
    local_34 = local_30;
  }
  nVar1.g = (char)(int)(local_34 * 255.0);
  nVar1.r = (char)(int)(local_28 * 255.0);
  local_38 = b;
  if (1.0 < b) {
    local_38 = 1.0;
  }
  if (local_38 <= 0.0) {
    local_40 = 0.0;
  }
  else {
    local_3c = b;
    if (1.0 < b) {
      local_3c = 1.0;
    }
    local_40 = local_3c;
  }
  nVar1.b = (char)(int)(local_40 * 255.0);
  local_44 = a;
  if (1.0 < a) {
    local_44 = 1.0;
  }
  if (local_44 <= 0.0) {
    local_4c = 0.0;
  }
  else {
    local_48 = a;
    if (1.0 < a) {
      local_48 = 1.0;
    }
    local_4c = local_48;
  }
  nVar1.a = (nk_byte)(int)(local_4c * 255.0);
  return nVar1;
}

Assistant:

NK_API struct nk_color
nk_rgba_f(float r, float g, float b, float a)
{
    struct nk_color ret;
    ret.r = (nk_byte)(NK_SATURATE(r) * 255.0f);
    ret.g = (nk_byte)(NK_SATURATE(g) * 255.0f);
    ret.b = (nk_byte)(NK_SATURATE(b) * 255.0f);
    ret.a = (nk_byte)(NK_SATURATE(a) * 255.0f);
    return ret;
}